

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O2

void __thiscall PiecewiseConstant2D_Integral_Test::TestBody(PiecewiseConstant2D_Integral_Test *this)

{
  pointer pfVar1;
  pointer pfVar2;
  Allocator AVar3;
  long lVar4;
  char *pcVar5;
  initializer_list<float> __l;
  span<const_float> data;
  span<const_float> data_00;
  span<const_float> func;
  span<const_float> func_00;
  AssertHelper local_270;
  AssertionResult gtest_ar_3;
  Float local_258 [2];
  vector<float,_std::allocator<float>_> values;
  Bounds2f local_238;
  Bounds2f local_228;
  PiecewiseConstant2D dist4;
  PiecewiseConstant2D dist3;
  PiecewiseConstant2D dist2;
  PiecewiseConstant2D dist;
  
  dist.domain.pMin.super_Tuple2<pbrt::Point2,_float>.x = 1.0;
  dist.domain.pMin.super_Tuple2<pbrt::Point2,_float>.y = 2.0;
  dist.domain.pMax.super_Tuple2<pbrt::Point2,_float>.x = 0.0;
  dist.domain.pMax.super_Tuple2<pbrt::Point2,_float>.y = 7.0;
  dist.pConditionalV.alloc.memoryResource = (memory_resource *)0x3f80000040400000;
  dist.pConditionalV.ptr = (PiecewiseConstant1D *)0x40000000;
  __l._M_len = 8;
  __l._M_array = (iterator)&dist;
  std::vector<float,_std::allocator<float>_>::vector(&values,__l,(allocator_type *)&dist2);
  pfVar1 = values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start;
  lVar4 = (long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
  AVar3.memoryResource = pstd::pmr::new_delete_resource();
  data.n = lVar4 >> 2;
  data.ptr = pfVar1;
  pbrt::PiecewiseConstant2D::PiecewiseConstant2D(&dist,data,4,2,AVar3);
  dist3.domain.pMin.super_Tuple2<pbrt::Point2,_float>.x = 2.8026e-45;
  dist4.domain.pMin.super_Tuple2<pbrt::Point2,_float>.x = dist.pMarginal.funcInt;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&dist2,"2","dist.Integral()",(int *)&dist3,(float *)&dist4);
  if (dist2.domain.pMin.super_Tuple2<pbrt::Point2,_float>.x._0_1_ == '\0') {
    testing::Message::Message((Message *)&dist3);
    if (dist2.domain.pMax.super_Tuple2<pbrt::Point2,_float> == (Tuple2<pbrt::Point2,_float>)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)dist2.domain.pMax.super_Tuple2<pbrt::Point2,_float>;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&dist4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x1af,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&dist4,(Message *)&dist3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&dist4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&dist3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&dist2.domain.pMax);
  pfVar1 = values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start;
  lVar4 = (long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
  AVar3.memoryResource = pstd::pmr::new_delete_resource();
  data_00.n = lVar4 >> 2;
  data_00.ptr = pfVar1;
  pbrt::PiecewiseConstant2D::PiecewiseConstant2D(&dist2,data_00,2,4,AVar3);
  dist4.domain.pMin.super_Tuple2<pbrt::Point2,_float>.x = 2.8026e-45;
  gtest_ar_3._0_4_ = dist2.pMarginal.funcInt;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&dist3,"2","dist2.Integral()",(int *)&dist4,(float *)&gtest_ar_3);
  if (dist3.domain.pMin.super_Tuple2<pbrt::Point2,_float>.x._0_1_ == '\0') {
    testing::Message::Message((Message *)&dist4);
    if (dist3.domain.pMax.super_Tuple2<pbrt::Point2,_float> == (Tuple2<pbrt::Point2,_float>)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)dist3.domain.pMax.super_Tuple2<pbrt::Point2,_float>;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x1b2,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&dist4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&dist4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&dist3.domain.pMax);
  pfVar2 = values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pfVar1 = values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start;
  dist4.domain.pMin.super_Tuple2<pbrt::Point2,_float>.x = 0.0;
  dist4.domain.pMin.super_Tuple2<pbrt::Point2,_float>.y = 0.0;
  gtest_ar_3.success_ = false;
  gtest_ar_3._1_7_ = 0x40000000408000;
  pbrt::Bounds2<float>::Bounds2(&local_228,(Point2<float> *)&dist4,(Point2<float> *)&gtest_ar_3);
  AVar3.memoryResource = pstd::pmr::new_delete_resource();
  func.n = (long)pfVar2 - (long)pfVar1 >> 2;
  func.ptr = pfVar1;
  pbrt::PiecewiseConstant2D::PiecewiseConstant2D(&dist3,func,4,2,local_228,AVar3);
  gtest_ar_3._0_4_ = 0x10;
  local_270.data_._0_4_ = dist3.pMarginal.funcInt;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&dist4,"16","dist3.Integral()",(int *)&gtest_ar_3,(float *)&local_270);
  if (dist4.domain.pMin.super_Tuple2<pbrt::Point2,_float>.x._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (dist4.domain.pMax.super_Tuple2<pbrt::Point2,_float> == (Tuple2<pbrt::Point2,_float>)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)dist4.domain.pMax.super_Tuple2<pbrt::Point2,_float>;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x1b5,pcVar5);
    testing::internal::AssertHelper::operator=(&local_270,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper(&local_270);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&dist4.domain.pMax);
  gtest_ar_3._0_8_ = vmovlps_avx(SUB6416(ZEXT464(0xbf800000),0));
  local_270.data_ = (AssertHelperData *)0x4080000000000000;
  pbrt::Bounds2<float>::Bounds2(&local_238,(Point2<float> *)&gtest_ar_3,(Point2<float> *)&local_270)
  ;
  AVar3.memoryResource = pstd::pmr::new_delete_resource();
  func_00.n = (long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
  func_00.ptr = values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
  pbrt::PiecewiseConstant2D::PiecewiseConstant2D(&dist4,func_00,4,2,local_238,AVar3);
  local_270.data_._0_4_ = 1.12104e-44;
  local_258[0] = dist4.pMarginal.funcInt;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&gtest_ar_3,"8","dist4.Integral()",(int *)&local_270,local_258);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_270);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x1b8,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_258,(Message *)&local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_258);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_270);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  pbrt::PiecewiseConstant2D::~PiecewiseConstant2D(&dist4);
  pbrt::PiecewiseConstant2D::~PiecewiseConstant2D(&dist3);
  pbrt::PiecewiseConstant2D::~PiecewiseConstant2D(&dist2);
  pbrt::PiecewiseConstant2D::~PiecewiseConstant2D(&dist);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&values.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

TEST(PiecewiseConstant2D, Integral) {
    std::vector<Float> values{Float(1), Float(2), Float(0), Float(7),
                              Float(3), Float(1), Float(2), Float(0)};

    PiecewiseConstant2D dist(values, 4, 2);
    EXPECT_EQ(2, dist.Integral());

    PiecewiseConstant2D dist2(values, 2, 4);
    EXPECT_EQ(2, dist2.Integral());

    PiecewiseConstant2D dist3(values, 4, 2, Bounds2f(Point2f(0, 0), Point2f(4, 2)));
    EXPECT_EQ(16, dist3.Integral());

    PiecewiseConstant2D dist4(values, 4, 2, Bounds2f(Point2f(-1, 0), Point2f(0, 4)));
    EXPECT_EQ(8, dist4.Integral());
}